

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.cpp
# Opt level: O1

uchar * base64_encode(uchar *str,int str_len)

{
  byte bVar1;
  byte bVar2;
  uchar *puVar3;
  long lVar4;
  int iVar5;
  byte *pbVar6;
  int iVar7;
  long lVar8;
  
  iVar7 = str_len % 3;
  iVar5 = (str_len / 3) * 4 + 4;
  if (iVar7 == 0) {
    iVar5 = (str_len / 3) * 4;
  }
  lVar8 = (long)iVar5;
  puVar3 = (uchar *)malloc(lVar8 + 1);
  puVar3[lVar8] = '\0';
  if (iVar5 < 3) {
    lVar4 = 0;
  }
  else {
    pbVar6 = str + 2;
    lVar4 = 0;
    do {
      bVar1 = pbVar6[-2];
      puVar3[lVar4] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[bVar1 >> 2]
      ;
      bVar2 = pbVar6[-1];
      puVar3[lVar4 + 1] =
           "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
           [(uint)(bVar2 >> 4) | (bVar1 & 3) << 4];
      bVar1 = *pbVar6;
      puVar3[lVar4 + 2] =
           "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
           [(uint)(bVar1 >> 6) + (bVar2 & 0xf) * 4];
      puVar3[lVar4 + 3] =
           "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[bVar1 & 0x3f];
      lVar4 = lVar4 + 4;
      pbVar6 = pbVar6 + 3;
    } while (lVar4 < lVar8 + -2);
  }
  if (iVar7 != 2) {
    if (iVar7 != 1) {
      return puVar3;
    }
    puVar3[lVar4 + -2] = '=';
  }
  puVar3[lVar4 + -1] = '=';
  return puVar3;
}

Assistant:

unsigned char *base64_encode(unsigned char *str,int str_len) {
    long len;
    unsigned char *res;
    int i, j;
//定义base64编码表
    unsigned char *base64_table = (unsigned char *) "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/";

//计算经过base64编码后的字符串长度
    if (str_len % 3 == 0)
        len = str_len / 3 * 4;
    else
        len = (str_len / 3 + 1) * 4;

    res = static_cast<unsigned char *>(malloc(sizeof(unsigned char) * len + 1));
    res[len] = '\0';

//以3个8位字符为一组进行编码
    for (i = 0, j = 0; i < len - 2; j += 3, i += 4) {
        res[i] = base64_table[str[j] >> 2]; //取出第一个字符的前6位并找出对应的结果字符
        res[i + 1] = base64_table[(str[j] & 0x3) << 4 | (str[j + 1] >> 4)]; //将第一个字符的后位与第二个字符的前4位进行组合并找到对应的结果字符
        res[i + 2] = base64_table[(str[j + 1] & 0xf) << 2 | (str[j + 2] >> 6)]; //将第二个字符的后4位与第三个字符的前2位组合并找出对应的结果字符
        res[i + 3] = base64_table[str[j + 2] & 0x3f]; //取出第三个字符的后6位并找出结果字符
    }

    switch (str_len % 3) {
        case 1:
            res[i - 2] = '=';
            res[i - 1] = '=';
            break;
        case 2:
            res[i - 1] = '=';
            break;
    }

    return res;
}